

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

void __thiscall pbrt::SquareMatrix<4>::SquareMatrix(SquareMatrix<4> *this)

{
  int i;
  long lVar1;
  int j;
  long lVar2;
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      (*(Float (*) [4])*(Float (*) [4])this)[lVar2] = (Float)((uint)(lVar1 == lVar2) * 0x3f800000);
    }
    this = (SquareMatrix<4> *)((long)this + 0x10);
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    SquareMatrix() {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                m[i][j] = (i == j) ? 1 : 0;
    }